

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O0

void __thiscall Belief::Belief(Belief *this,StateDistribution *belief)

{
  undefined8 in_RSI;
  StateDistributionVector *in_RDI;
  
  BeliefInterface::BeliefInterface((BeliefInterface *)in_RDI);
  (in_RDI->super_StateDistribution)._vptr_StateDistribution = (_func_int **)&PTR__Belief_00d30bd0;
  (in_RDI->super_StateDistribution)._vptr_StateDistribution = (_func_int **)&PTR__Belief_00d30bd0;
  StateDistributionVector::StateDistributionVector(in_RDI);
  (*(in_RDI->super_StateDistribution)._vptr_StateDistribution[5])(in_RDI,in_RSI);
  return;
}

Assistant:

Belief::Belief(const StateDistribution& belief)
{
    this->Set(belief);
}